

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm_avx2.h
# Opt level: O0

void btf_32_avx2_type0_new
               (__m256i ww0,__m256i ww1,__m256i *in0,__m256i *in1,__m256i _r,int32_t cos_bit)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  uint in_EDX;
  undefined1 (*in_RSI) [32];
  undefined1 (*in_RDI) [32];
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM0_Qb;
  undefined8 in_YMM0_H;
  undefined8 in_register_00001218;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM1_Qb;
  undefined8 in_YMM1_H;
  undefined8 in_register_00001258;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM2_Qb;
  undefined8 in_YMM2_H;
  undefined8 in_register_00001298;
  __m256i temp1;
  __m256i in1_w0;
  __m256i in0_w1;
  __m256i temp0;
  __m256i in1_w1;
  __m256i in0_w0;
  __m256i _in1;
  __m256i _in0;
  
  auVar4 = *in_RDI;
  auVar7 = *in_RSI;
  auVar6._8_8_ = in_XMM0_Qb;
  auVar6._0_8_ = in_XMM0_Qa;
  auVar6._16_8_ = in_YMM0_H;
  auVar6._24_8_ = in_register_00001218;
  auVar1 = vpmulld_avx2(*in_RDI,auVar6);
  auVar5._8_8_ = in_XMM1_Qb;
  auVar5._0_8_ = in_XMM1_Qa;
  auVar5._16_8_ = in_YMM1_H;
  auVar5._24_8_ = in_register_00001258;
  auVar2 = vpmulld_avx2(*in_RSI,auVar5);
  auVar1 = vpaddd_avx2(auVar1,auVar2);
  auVar3._8_8_ = in_XMM2_Qb;
  auVar3._0_8_ = in_XMM2_Qa;
  auVar3._16_8_ = in_YMM2_H;
  auVar3._24_8_ = in_register_00001298;
  auVar1 = vpaddd_avx2(auVar1,auVar3);
  auVar1 = vpsrad_avx2(auVar1,ZEXT416(in_EDX));
  *in_RDI = auVar1;
  auVar1._8_8_ = in_XMM1_Qb;
  auVar1._0_8_ = in_XMM1_Qa;
  auVar1._16_8_ = in_YMM1_H;
  auVar1._24_8_ = in_register_00001258;
  auVar1 = vpmulld_avx2(auVar4,auVar1);
  auVar4._8_8_ = in_XMM0_Qb;
  auVar4._0_8_ = in_XMM0_Qa;
  auVar4._16_8_ = in_YMM0_H;
  auVar4._24_8_ = in_register_00001218;
  auVar2 = vpmulld_avx2(auVar7,auVar4);
  auVar1 = vpsubd_avx2(auVar1,auVar2);
  auVar2._8_8_ = in_XMM2_Qb;
  auVar2._0_8_ = in_XMM2_Qa;
  auVar2._16_8_ = in_YMM2_H;
  auVar2._24_8_ = in_register_00001298;
  auVar1 = vpaddd_avx2(auVar1,auVar2);
  auVar1 = vpsrad_avx2(auVar1,ZEXT416(in_EDX));
  *in_RSI = auVar1;
  return;
}

Assistant:

static inline void btf_32_avx2_type0_new(const __m256i ww0, const __m256i ww1,
                                         __m256i *in0, __m256i *in1,
                                         const __m256i _r,
                                         const int32_t cos_bit) {
  __m256i _in0 = *in0;
  __m256i _in1 = *in1;
  const __m256i in0_w0 = _mm256_mullo_epi32(_in0, ww0);
  const __m256i in1_w1 = _mm256_mullo_epi32(_in1, ww1);
  __m256i temp0 = _mm256_add_epi32(in0_w0, in1_w1);
  temp0 = _mm256_add_epi32(temp0, _r);
  *in0 = _mm256_srai_epi32(temp0, cos_bit);
  const __m256i in0_w1 = _mm256_mullo_epi32(_in0, ww1);
  const __m256i in1_w0 = _mm256_mullo_epi32(_in1, ww0);
  __m256i temp1 = _mm256_sub_epi32(in0_w1, in1_w0);
  temp1 = _mm256_add_epi32(temp1, _r);
  *in1 = _mm256_srai_epi32(temp1, cos_bit);
}